

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::GetCatchCount(TypeChecker *this,Index depth,Index *out_count)

{
  Result RVar1;
  Enum EVar2;
  long lVar3;
  Index IVar4;
  Label *unused;
  
  RVar1 = GetLabel(this,depth,&unused);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    IVar4 = 0;
    for (lVar3 = 0; (ulong)(depth + 1) * 0x48 + lVar3 != 0; lVar3 = lVar3 + -0x48) {
      IVar4 = IVar4 + (*(int *)((long)&(this->label_stack_).
                                       super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>
                                       ._M_impl.super__Vector_impl_data._M_finish[-1].label_type +
                               lVar3) == 8);
    }
    *out_count = IVar4;
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result TypeChecker::GetCatchCount(Index depth, Index* out_count) {
  Label* unused;
  if (Failed(GetLabel(depth, &unused))) {
    return Result::Error;
  }

  Index catch_count = 0;
  for (Index idx = 0; idx <= depth; idx++) {
    LabelType type = label_stack_[label_stack_.size() - idx - 1].label_type;
    if (type == LabelType::Catch) {
      catch_count++;
    }
  }
  *out_count = catch_count;

  return Result::Ok;
}